

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_false,_false>::enumerate
          (DaTrie<true,_false,_false> *this,uint32_t node_pos,string *prefix,
          vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pBVar2;
  pointer pcVar3;
  Bc BVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  __string_type __str;
  value_type local_58;
  
  uVar5 = (ulong)node_pos;
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar2 >> 3) <= uVar5) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x8a,
                  "void ddd::DaTrie<true, false, false>::enumerate(uint32_t, const std::string &, std::vector<KvPair> &) const [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  if (-1 < (long)pBVar2[uVar5]) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x8b,
                  "void ddd::DaTrie<true, false, false>::enumerate(uint32_t, const std::string &, std::vector<KvPair> &) const [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  uVar7 = SUB84(pBVar2[uVar5],0);
  if ((int)uVar7 < 0) {
    paVar1 = &local_58.key.field_2;
    local_58.key._M_string_length = 0;
    local_58.key.field_2._M_local_buf[0] = '\0';
    local_58.key._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_58);
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    BVar4 = pBVar2[uVar5];
    local_58.value = BVar4._0_4_;
    if ((node_pos == 0 || -1 < (int)local_58.value) ||
       ((*(uint *)(&pBVar2->field_0x0 + ((ulong)BVar4 >> 0x1d & 0x3fffffff8)) & 0x7fffffff) !=
        node_pos)) {
      for (uVar7 = local_58.value & 0x7fffffff;
          (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] != '\0'; uVar7 = uVar7 + 1) {
        std::__cxx11::string::push_back((char)&local_58);
      }
      std::__cxx11::string::push_back((char)&local_58);
      local_58.value =
           *(uint32_t *)
            ((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + (uVar7 + 1));
    }
    else {
      local_58.value = local_58.value & 0x7fffffff;
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::push_back(kvs,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.key._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.key._M_dataplus._M_p);
    }
  }
  else {
    if ((*(uint *)&pBVar2[uVar7 & 0x7fffffff].field_0x4 & 0x7fffffff) == node_pos) {
      enumerate(this,uVar7,prefix,kvs);
    }
    uVar6 = 1;
    do {
      if ((*(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar6 ^ uVar7].field_0x4 & 0x7fffffff) ==
          node_pos) {
        local_58.key._M_dataplus._M_p = (pointer)&local_58.key.field_2;
        pcVar3 = (prefix->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar3,pcVar3 + prefix->_M_string_length);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&local_58,local_58.key._M_string_length,0,'\x01');
        enumerate(this,uVar6 ^ uVar7,&local_58.key,kvs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.key._M_dataplus._M_p != &local_58.key.field_2) {
          operator_delete(local_58.key._M_dataplus._M_p);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x100);
  }
  return;
}

Assistant:

void enumerate(uint32_t node_pos, const std::string& prefix, std::vector<KvPair>& kvs) const {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(!Prefix);

    if (bc_[node_pos].is_leaf()) {
      KvPair kv;
      kv.key = prefix;
      if (is_terminal_(node_pos)) {
        kv.value = bc_[node_pos].value();
      } else {
        auto tail_pos = bc_[node_pos].value();
        while (tail_[tail_pos] != '\0') {
          kv.key += tail_[tail_pos++];
        }
        kv.key += tail_[tail_pos++];
        kv.value = utils::extract_value(tail_.data() + tail_pos);
      }
      kvs.push_back(kv);
      return;
    }

    auto base = bc_[node_pos].base();
    auto child_pos = base ^static_cast<uint8_t>('\0');
    if (bc_[child_pos].check() == node_pos) {
      enumerate(child_pos, prefix, kvs);
    }

    for (uint32_t label = 1; label < 256; ++label) {
      child_pos = base ^ label;
      if (bc_[child_pos].check() == node_pos) {
        enumerate(child_pos, prefix + static_cast<char>(label), kvs);
      }
    }
  }